

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O3

char * Wlc_PrsConvertInitValues(Wlc_Ntk_t *p)

{
  uint uVar1;
  char *pcVar2;
  int iVar3;
  uint *__ptr;
  void *pvVar4;
  Vec_Int_t *pVVar5;
  uint uVar6;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar7;
  int *piVar8;
  ushort uVar9;
  size_t sVar10;
  long lVar11;
  Wlc_Obj_t *pWVar12;
  uint uVar13;
  byte bVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 1000;
  __ptr[1] = 0;
  pvVar4 = malloc(1000);
  *(void **)(__ptr + 2) = pvVar4;
  pVVar5 = p->vInits;
  if (pVVar5->nSize < 1) {
    uVar6 = 0;
  }
  else {
    lVar11 = 0;
    do {
      iVar18 = pVVar5->pArray[lVar11];
      if ((long)iVar18 < 0) {
        iVar18 = -iVar18;
        if (iVar18 < 2) {
          iVar18 = 1;
        }
        do {
          uVar6 = __ptr[1];
          if (uVar6 == *__ptr) {
            if ((int)uVar6 < 0x10) {
              if (*(void **)(__ptr + 2) == (void *)0x0) {
                pvVar4 = malloc(0x10);
              }
              else {
                pvVar4 = realloc(*(void **)(__ptr + 2),0x10);
              }
              *(void **)(__ptr + 2) = pvVar4;
              *__ptr = 0x10;
            }
            else {
              sVar10 = (ulong)uVar6 * 2;
              if (*(void **)(__ptr + 2) == (void *)0x0) {
                pvVar4 = malloc(sVar10);
              }
              else {
                pvVar4 = realloc(*(void **)(__ptr + 2),sVar10);
              }
              *(void **)(__ptr + 2) = pvVar4;
              *__ptr = (uint)sVar10;
            }
          }
          else {
            pvVar4 = *(void **)(__ptr + 2);
          }
          __ptr[1] = uVar6 + 1;
          *(undefined1 *)((long)pvVar4 + (long)(int)uVar6) = 0x30;
          iVar18 = iVar18 + -1;
        } while (iVar18 != 0);
        pVVar5 = p->vInits;
      }
      else {
        if ((iVar18 == 0) || (p->nObjsAlloc <= iVar18)) {
LAB_00374eb0:
          __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                        ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
        }
        pWVar12 = p->pObjs + iVar18;
        uVar13 = pWVar12->End - pWVar12->Beg;
        uVar6 = -uVar13;
        if (0 < (int)uVar13) {
          uVar6 = uVar13;
        }
        while( true ) {
          uVar9 = *(ushort *)pWVar12 & 0x3f;
          if (uVar9 != 7) break;
          paVar7 = &pWVar12->field_10;
          if (2 < pWVar12->nFanins) {
            paVar7 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar7->pFanins[0];
          }
          iVar18 = paVar7->Fanins[0];
          if (((long)iVar18 < 1) || (p->nObjsAlloc <= iVar18)) goto LAB_00374eb0;
          pWVar12 = p->pObjs + iVar18;
        }
        if ((uVar9 == 6) && ((*(ushort *)pWVar12 >> 0xb & 1) == 0)) {
          piVar8 = (pWVar12->field_10).pFanins[0];
        }
        else {
          piVar8 = (int *)0x0;
        }
        uVar17 = 0xffffffff;
        do {
          uVar15 = uVar17 + 1;
          if (piVar8 == (int *)0x0) {
            bVar14 = 0x78;
          }
          else {
            bVar14 = ((uint)piVar8[uVar15 >> 5] >> (uVar15 & 0x1f) & 1) != 0 | 0x30;
          }
          uVar1 = __ptr[1];
          if (uVar1 == *__ptr) {
            if ((int)uVar1 < 0x10) {
              if (*(void **)(__ptr + 2) == (void *)0x0) {
                pvVar4 = malloc(0x10);
              }
              else {
                pvVar4 = realloc(*(void **)(__ptr + 2),0x10);
              }
              *(void **)(__ptr + 2) = pvVar4;
              *__ptr = 0x10;
            }
            else {
              sVar10 = (ulong)uVar1 * 2;
              if (*(void **)(__ptr + 2) == (void *)0x0) {
                pvVar4 = malloc(sVar10);
              }
              else {
                pvVar4 = realloc(*(void **)(__ptr + 2),sVar10);
              }
              *(void **)(__ptr + 2) = pvVar4;
              *__ptr = (uint)sVar10;
            }
          }
          else {
            pvVar4 = *(void **)(__ptr + 2);
          }
          __ptr[1] = uVar1 + 1;
          *(byte *)((long)pvVar4 + (long)(int)uVar1) = bVar14;
          iVar3 = pWVar12->End - pWVar12->Beg;
          iVar18 = -iVar3;
          if (0 < iVar3) {
            iVar18 = iVar3;
          }
          uVar1 = iVar18 + 1U;
          if ((int)(uVar6 + 1) < (int)(iVar18 + 1U)) {
            uVar1 = uVar6 + 1;
          }
          uVar16 = uVar17 + 2;
          uVar17 = uVar15;
        } while (uVar16 < uVar1);
        if (uVar15 < uVar6) {
          uVar17 = -uVar13;
          if (0 < (int)uVar13) {
            uVar17 = uVar13;
          }
          do {
            uVar13 = __ptr[1];
            if (uVar13 == *__ptr) {
              if ((int)uVar13 < 0x10) {
                if (*(void **)(__ptr + 2) == (void *)0x0) {
                  pvVar4 = malloc(0x10);
                }
                else {
                  pvVar4 = realloc(*(void **)(__ptr + 2),0x10);
                }
                *(void **)(__ptr + 2) = pvVar4;
                *__ptr = 0x10;
              }
              else {
                sVar10 = (ulong)uVar13 * 2;
                if (*(void **)(__ptr + 2) == (void *)0x0) {
                  pvVar4 = malloc(sVar10);
                }
                else {
                  pvVar4 = realloc(*(void **)(__ptr + 2),sVar10);
                }
                *(void **)(__ptr + 2) = pvVar4;
                *__ptr = (uint)sVar10;
              }
            }
            else {
              pvVar4 = *(void **)(__ptr + 2);
            }
            __ptr[1] = uVar13 + 1;
            *(undefined1 *)((long)pvVar4 + (long)(int)uVar13) = 0x30;
            uVar17 = uVar17 - 1;
          } while (uVar15 != uVar17);
        }
        pVVar5 = p->vInits;
        if ((piVar8 == (int *)0x0) && ((*(uint *)pWVar12 >> 0xb & 1) == 0)) {
          if (((ushort)*(uint *)pWVar12 & 0x3d) != 1) {
            __assert_fail("Wlc_ObjIsCi(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                          ,0x12d,"int Wlc_ObjCiId(Wlc_Obj_t *)");
          }
          uVar6 = (pWVar12->field_10).Fanins[1];
        }
        else {
          uVar6 = ~uVar6;
        }
        if (pVVar5->nSize <= lVar11) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        pVVar5->pArray[lVar11] = uVar6;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < pVVar5->nSize);
    uVar13 = *__ptr;
    uVar6 = __ptr[1];
    if (uVar6 == uVar13) {
      if ((int)uVar13 < 0x10) {
        pvVar4 = *(void **)(__ptr + 2);
        if (pvVar4 == (void *)0x0) {
          sVar10 = 0x10;
          goto LAB_00374e82;
        }
        sVar10 = 0x10;
LAB_00374e71:
        pvVar4 = realloc(pvVar4,sVar10);
      }
      else {
        sVar10 = (ulong)uVar13 * 2;
        pvVar4 = *(void **)(__ptr + 2);
        if (pvVar4 != (void *)0x0) goto LAB_00374e71;
LAB_00374e82:
        pvVar4 = malloc(sVar10);
      }
      *(void **)(__ptr + 2) = pvVar4;
      goto LAB_00374e8b;
    }
  }
  pvVar4 = *(void **)(__ptr + 2);
LAB_00374e8b:
  *(undefined1 *)((long)pvVar4 + (long)(int)uVar6) = 0;
  pcVar2 = *(char **)(__ptr + 2);
  free(__ptr);
  return pcVar2;
}

Assistant:

char * Wlc_PrsConvertInitValues( Wlc_Ntk_t * p )
{
    Wlc_Obj_t * pObj; 
    int i, k, Value, * pInits;
    char * pResult;
    Vec_Str_t * vStr = Vec_StrAlloc( 1000 );
    Vec_IntForEachEntry( p->vInits, Value, i )
    {
        if ( Value < 0 )
        {
            for ( k = 0; k < -Value; k++ )
                Vec_StrPush( vStr, '0' );
            continue;
        }
        pObj = Wlc_NtkObj( p, Value );
        Value = Wlc_ObjRange(pObj);
        while ( pObj->Type == WLC_OBJ_BUF )
            pObj = Wlc_NtkObj( p, Wlc_ObjFaninId0(pObj) );
        pInits = (pObj->Type == WLC_OBJ_CONST && !pObj->fXConst) ? Wlc_ObjConstValue(pObj) : NULL;
        for ( k = 0; k < Abc_MinInt(Value, Wlc_ObjRange(pObj)); k++ )
            Vec_StrPush( vStr, (char)(pInits ? '0' + Abc_InfoHasBit((unsigned *)pInits, k) : 'x') );
        // extend values with zero, in case the init value signal has different range compared to constant used
        for ( ; k < Value; k++ )
            Vec_StrPush( vStr, '0' );
        // update vInits to contain either number of values or PI index
        Vec_IntWriteEntry( p->vInits, i, (pInits || pObj->fXConst) ? -Value : Wlc_ObjCiId(pObj) );
    }
    Vec_StrPush( vStr, '\0' );
    pResult = Vec_StrReleaseArray( vStr );
    Vec_StrFree( vStr );
    return pResult;
}